

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O2

void __thiscall
amrex::EB2::Level::fillAreaFrac(Level *this,Array<MultiCutFab_*,_3> *a_areafrac,Geometry *geom)

{
  int *piVar1;
  int dst_nghost;
  int num_comp;
  MultiCutFab *dstmf;
  element_type *peVar2;
  uint uVar3;
  undefined8 uVar4;
  pointer ppVar5;
  pointer pIVar6;
  bool bVar7;
  int i;
  CutFab *pCVar8;
  pointer ppVar9;
  BaseFab<double> *this_00;
  int idim;
  long lVar10;
  pointer v;
  int idim_1;
  Periodicity PVar11;
  FabArray<amrex::FArrayBox> *local_328;
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box bx;
  Box r_1;
  _Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_288;
  undefined1 local_270 [24];
  pointer local_258;
  pointer pbStack_250;
  Array4<double> local_230;
  MultiFab tmp;
  Array4<double> local_70;
  
  if (this->m_allregular == true) {
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      MultiCutFab::setVal(a_areafrac->_M_elems[lVar10],1.0);
    }
  }
  else {
    local_328 = (FabArray<amrex::FArrayBox> *)&this->m_areafrac;
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      dstmf = a_areafrac->_M_elems[lVar10];
      local_270._1_7_ = 0;
      local_270[0] = true;
      local_258 = (pointer)0x0;
      pbStack_250 = (pointer)0x0;
      local_270._8_4_ = 0;
      local_270._12_4_ = 0;
      local_270._16_8_ = (pointer)0x0;
      local_230.p = (double *)&PTR__FabFactory_006d8928;
      MultiFab::MultiFab((MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>,
                         &(dstmf->m_data).super_FabArrayBase.boxarray,
                         &(dstmf->m_data).super_FabArrayBase.distributionMap,
                         (dstmf->m_data).super_FabArrayBase.n_comp,
                         (dstmf->m_data).super_FabArrayBase.n_grow.vect[0],(MFInfo *)local_270,
                         (FabFactory<amrex::FArrayBox> *)&local_230);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_270 + 0x10));
      FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&tmp.super_FabArray<amrex::FArrayBox>,1.0);
      dst_nghost = (dstmf->m_data).super_FabArrayBase.n_grow.vect[0];
      num_comp = (dstmf->m_data).super_FabArrayBase.n_comp;
      PVar11 = Geometry::periodicity(geom);
      local_270[0] = PVar11.period.vect[0]._0_1_;
      local_270._1_7_ = PVar11.period.vect._1_7_;
      local_270._8_4_ = PVar11.period.vect[2];
      FabArray<amrex::FArrayBox>::ParallelCopy
                (&tmp.super_FabArray<amrex::FArrayBox>,local_328,0,0,num_comp,0,dst_nghost,
                 (Periodicity *)local_270,COPY);
      anon_unknown_2::copyMultiFabToMultiCutFab
                (dstmf,(MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>);
      MultiFab::~MultiFab((MultiFab *)&tmp.super_FabArray<amrex::FArrayBox>);
      local_328 = local_328 + 1;
    }
    tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._0_12_ = Geometry::periodicity(geom);
    Periodicity::shiftIntVect
              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)&local_288,
               (Periodicity *)&tmp);
    peVar2 = (this->m_covered_grids).m_ref.
             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        *(pointer *)
         ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data + 8)) {
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      isects.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      MFIter::MFIter((MFIter *)&tmp,(FabArrayBase *)a_areafrac->_M_elems[0],'\0');
      while (tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
             m_loshft.vect[0] <
             tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
             m_loshft.vect[2]) {
        bVar7 = MultiCutFab::ok(a_areafrac->_M_elems[0],(MFIter *)&tmp);
        if (bVar7) {
          pCVar8 = MultiCutFab::operator[](a_areafrac->_M_elems[0],(MFIter *)&tmp);
          bx.smallend.vect._0_8_ =
               *(undefined8 *)(pCVar8->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect;
          uVar4 = *(undefined8 *)(pCVar8->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect;
          bx.smallend.vect[2] =
               (int)*(undefined8 *)
                     ((pCVar8->super_FArrayBox).super_BaseFab<double>.domain.smallend.vect + 2);
          bx.bigend.vect[0] = (int)uVar4;
          bx.bigend.vect[1] = (int)((ulong)uVar4 >> 0x20);
          bx._20_8_ = *(undefined8 *)
                       ((pCVar8->super_FArrayBox).super_BaseFab<double>.domain.bigend.vect + 2);
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            if ((bx.btype.itype >> ((uint)lVar10 & 0x1f) & 1) != 0) {
              piVar1 = bx.bigend.vect + lVar10;
              *piVar1 = *piVar1 + -1;
            }
          }
          bx._20_8_ = bx._20_8_ & 0xffffffff;
          MultiCutFab::array((Array4<double> *)local_270,a_areafrac->_M_elems[0],(MFIter *)&tmp);
          MultiCutFab::array(&local_230,a_areafrac->_M_elems[1],(MFIter *)&tmp);
          MultiCutFab::array(&local_70,a_areafrac->_M_elems[2],(MFIter *)&tmp);
          pIVar6 = local_288._M_impl.super__Vector_impl_data._M_finish;
          for (v = local_288._M_impl.super__Vector_impl_data._M_start; v != pIVar6; v = v + 1) {
            r.bigend.vect[1] = bx.bigend.vect[1];
            r.bigend.vect[2] = bx.bigend.vect[2];
            r.btype.itype = bx.btype.itype;
            r.smallend.vect[0] = bx.smallend.vect[0];
            r.smallend.vect[1] = bx.smallend.vect[1];
            r.smallend.vect[2] = bx.smallend.vect[2];
            r.bigend.vect[0] = bx.bigend.vect[0];
            Box::operator+=(&r,v);
            BoxArray::intersections(&this->m_covered_grids,&r,&isects);
            ppVar5 = isects.
                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (ppVar9 = isects.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar5;
                ppVar9 = ppVar9 + 1) {
              for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                r_1.smallend.vect._0_8_ = *(undefined8 *)(ppVar9->second).smallend.vect;
                uVar4 = *(undefined8 *)((ppVar9->second).smallend.vect + 2);
                r_1._20_8_ = *(undefined8 *)((ppVar9->second).bigend.vect + 2);
                r_1.bigend.vect[1] =
                     (int)((ulong)*(undefined8 *)(ppVar9->second).bigend.vect >> 0x20);
                r_1.smallend.vect[2] = (int)uVar4;
                r_1.bigend.vect[0] = (int)((ulong)uVar4 >> 0x20);
                Box::operator-=(&r_1,v);
                r.bigend.vect[1] = r_1.bigend.vect[1];
                r.bigend.vect[2] = r_1.bigend.vect[2];
                r.btype.itype = r_1.btype.itype;
                uVar4 = r._20_8_;
                r.smallend.vect[0] = r_1.smallend.vect[0];
                r.smallend.vect[1] = r_1.smallend.vect[1];
                r.smallend.vect[2] = r_1.smallend.vect[2];
                r.bigend.vect[0] = r_1.bigend.vect[0];
                r.btype.itype = r_1.btype.itype;
                uVar3 = r.btype.itype >> ((uint)lVar10 & 0x1f);
                r._20_8_ = uVar4;
                if ((uVar3 & 1) == 0) {
                  piVar1 = r.bigend.vect + lVar10;
                  *piVar1 = *piVar1 + 1;
                  r.btype.itype = r.btype.itype | 1 << ((byte)lVar10 & 0x1f);
                }
                this_00 = (BaseFab<double> *)
                          MultiCutFab::operator[](a_areafrac->_M_elems[lVar10],(MFIter *)&tmp);
                r_1.smallend.vect[0] = 0;
                r_1.smallend.vect[1] = 0;
                BaseFab<double>::setVal<(amrex::RunOn)1>
                          (this_00,(double *)&r_1,&r,(DestComp)0x0,(NumComps)0x1);
              }
            }
          }
        }
        MFIter::operator++((MFIter *)&tmp);
      }
      MFIter::~MFIter((MFIter *)&tmp);
      std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
      ~_Vector_base(&isects.
                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                   );
    }
    std::_Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~_Vector_base(&local_288);
  }
  return;
}

Assistant:

void
Level::fillAreaFrac (Array<MultiCutFab*,AMREX_SPACEDIM> const& a_areafrac, const Geometry& geom) const
{
    if (isAllRegular()) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            a_areafrac[idim]->setVal(1.0);
        }
        return;
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        MultiCutFab& areafrac = *a_areafrac[idim];
        MultiFab tmp(areafrac.boxArray(), areafrac.DistributionMap(),
                     areafrac.nComp(), areafrac.nGrow());
        tmp.setVal(1.0);
        tmp.ParallelCopy(m_areafrac[idim],0,0,areafrac.nComp(),
                         0,areafrac.nGrow(),geom.periodicity());
        copyMultiFabToMultiCutFab(areafrac, tmp);
    }

    const std::vector<IntVect>& pshifts = geom.periodicity().shiftIntVect();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    if (!m_covered_grids.empty())
    {
        std::vector<std::pair<int,Box> > isects;
        for (MFIter mfi(a_areafrac[0]->data()); mfi.isValid(); ++mfi)
        {
            if (a_areafrac[0]->ok(mfi))
            {
                const Box& ccbx = amrex::enclosedCells((*a_areafrac[0])[mfi].box());
                AMREX_D_TERM(auto const& apx = a_areafrac[0]->array(mfi);,
                             auto const& apy = a_areafrac[1]->array(mfi);,
                             auto const& apz = a_areafrac[2]->array(mfi););
                for (const auto& iv : pshifts)
                {
                    m_covered_grids.intersections(ccbx+iv, isects);
                    for (const auto& is : isects) {
                        if (Gpu::inLaunchRegion()) {
                            const Box& bx = is.second-iv;
                            AMREX_D_TERM(const Box& xbx = amrex::surroundingNodes(bx,0);,
                                         const Box& ybx = amrex::surroundingNodes(bx,1);,
                                         const Box& zbx = amrex::surroundingNodes(bx,2););
                            amrex::ParallelFor(AMREX_D_DECL(xbx,ybx,zbx),
                              [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                              {
                                  apx(i,j,k) = 0.0;
                              }
#if (AMREX_SPACEDIM >= 2)
                            , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                              {
                                  apy(i,j,k) = 0.0;
                              }
#if (AMREX_SPACEDIM == 3)
                            , [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                              {
                                  apz(i,j,k) = 0.0;
                              }
#endif
#endif
                            );
                        } else {
                            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                                const Box& fbx = amrex::surroundingNodes(is.second-iv,idim);
                                (*a_areafrac[idim])[mfi].setVal<RunOn::Host>(0.0, fbx, 0, 1);
                            }
                        }
                    }
                }
            }
        }
    }
}